

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this)

{
  uint __tmp;
  uint uVar1;
  long lVar2;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<unsigned_int,_(unsigned_char)__x04_> local_18;
  
  uVar1 = Pop<unsigned_int>(this);
  lVar2 = 0;
  do {
    *(uint *)((long)local_18.v + lVar2) = uVar1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,local_18);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}